

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

bool __thiscall GT5VolumeFile::parseHeader(GT5VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  pointer pSVar1;
  char *pcVar2;
  pointer puVar3;
  pointer pSVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  uint64_t uVar10;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  uint32_t seed;
  VolumeFile *this_00;
  GT5VolumeFile *this_01;
  uint uVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char titleId [128];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  put_holder<char,_std::char_traits<char>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if ((this->super_VolumeFile).m_swapEndian == true) {
    if (*(int *)header != 0x6251745b) {
      return false;
    }
    seed = swap_bytes(*(undefined4 *)(header + 4));
    uVar12 = swap_bytes(*(undefined4 *)(header + 8));
    uVar9 = swap_bytes(*(undefined4 *)(header + 0xc));
  }
  else {
    if (*(int *)header != 0x5b745162) {
      return false;
    }
    seed = *(uint32_t *)(header + 4);
    uVar12 = *(uint *)(header + 8);
    uVar9 = *(uint *)(header + 0xc);
  }
  local_b8 = *(undefined8 *)(header + 0x20);
  uStack_b0 = *(undefined8 *)(header + 0x28);
  uStack_a8 = *(undefined8 *)(header + 0x30);
  uStack_a0 = *(undefined8 *)(header + 0x38);
  uStack_98 = *(undefined8 *)(header + 0x40);
  uStack_90 = *(undefined8 *)(header + 0x48);
  uStack_88 = *(undefined8 *)(header + 0x50);
  uStack_80 = *(undefined8 *)(header + 0x58);
  local_78 = *(undefined8 *)(header + 0x60);
  uStack_70 = *(undefined8 *)(header + 0x68);
  uStack_68 = *(undefined8 *)(header + 0x70);
  uStack_60 = *(undefined8 *)(header + 0x78);
  uStack_58 = *(undefined8 *)(header + 0x80);
  uStack_50 = *(undefined8 *)(header + 0x88);
  uStack_48 = *(undefined8 *)(header + 0x90);
  uStack_40 = *(undefined8 *)(header + 0x98);
  this_00 = (VolumeFile *)&this->m_titleId;
  pcVar2 = (char *)(this->m_titleId)._M_string_length;
  strlen((char *)&local_b8);
  std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar2,(ulong)&local_b8);
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VolumeFile::readDataAt
            (this_00,&(this->super_VolumeFile).m_mainStream,&local_1c8,0x800,(ulong)uVar12);
  this_01 = this;
  VolumeFile::decryptData
            (&this->super_VolumeFile,
             local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,seed);
  bVar7 = VolumeFile::inflateDataIfNeeded(&this_01->super_VolumeFile,&local_1c8,(ulong)uVar9);
  if (bVar7) {
    (this->super_VolumeFile).m_dataOffset = (ulong)uVar12 + 0xfff & 0xfffffffffffff800;
    puVar3 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar5 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
    local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar3;
    std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::emplace_back<>
              (&(this->super_VolumeFile).m_dataStreams);
    pSVar4 = (this->super_VolumeFile).m_dataStreams.
             super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_assign((string *)&pSVar4[-1].filePath);
    pSVar1 = pSVar4 + -1;
    std::ifstream::open((string *)pSVar1,(_Ios_Openmode)&pSVar4[-1].filePath);
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 != '\0') {
      std::istream::seekg((long)pSVar1,_S_beg);
      uVar10 = std::istream::tellg();
      pSVar4[-1].fileSize = uVar10;
      std::istream::seekg((long)pSVar1,_S_beg);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_1b0,"Data file size: %1%");
      local_d0.put_head =
           boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long>;
      local_d0.put_last =
           boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long>;
      local_d0.arg = &pSVar4[-1].fileSize;
      f = boost::io::detail::
          feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                    (&local_1b0,&local_d0);
      pbVar11 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,f);
      std::ios::widen((char)pbVar11->_vptr_basic_ostream[-3] + (char)pbVar11);
      std::ostream::put((char)pbVar11);
      std::ostream::flush();
      if (local_1b0.loc_.super_type.m_initialized == true) {
        std::locale::~locale((locale *)&local_1b0.loc_.super_type.m_storage);
        local_1b0.loc_.super_type.m_initialized = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf(&local_1b0.buf_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.prefix_._M_dataplus._M_p != &local_1b0.prefix_.field_2) {
        operator_delete(local_1b0.prefix_._M_dataplus._M_p,
                        local_1b0.prefix_.field_2._M_allocated_capacity + 1);
      }
      if (local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_start.super__Bit_iterator_base._M_offset = 0;
        local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_1b0.bound_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
        ._M_end_of_storage = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0.items_);
      bVar7 = true;
      goto LAB_0011d02c;
    }
  }
  bVar7 = false;
LAB_0011d02c:
  if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool GT5VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t); // TODO: segment index actually?
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto unk = VOLUME_READ_NEXT_SELF(p, uint64_t);
	const auto fileSize = VOLUME_READ_NEXT_SELF(p, uint64_t);
	UNUSED(fileSize);

	char titleId[128];
	VOLUME_READN_NEXT_SELF(p, char, titleId, sizeof(titleId));
	m_titleId = titleId;

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = alignUp(headerSizeAligned + zDataSize, SEGMENT_SIZE);
	m_data.swap(data);

	m_dataStreams.emplace_back();
	auto& streamDesc = m_dataStreams.back();
	{
		streamDesc.filePath = m_origPath.string();
		if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
			return false;
		}
		std::cout << boost::format("Data file size: %1%") % streamDesc.fileSize << std::endl;
	}

	return true;
}